

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidget::setHeaderItem(QTreeWidget *this,QTreeWidgetItem *item)

{
  int iVar1;
  int iVar2;
  Orientation OVar3;
  QModelIndex *pQVar4;
  long lVar5;
  QTreeWidgetPrivate *d;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (item != (QTreeWidgetItem *)0x0) {
    lVar5 = *(long *)&(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.
                      super_QFrame.super_QWidget.field_0x8;
    item->view = this;
    local_38 = 0xffffffffffffffff;
    local_30 = 0;
    uStack_28 = 0;
    iVar2 = (**(code **)(**(long **)(lVar5 + 0x2f8) + 0x80))();
    iVar1 = (int)(item->values).d.size;
    if (iVar2 < iVar1) {
      pQVar4 = (QModelIndex *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
      local_38 = 0xffffffffffffffff;
      local_30 = 0;
      uStack_28 = 0;
      QAbstractItemModel::beginInsertColumns(pQVar4,(int)&local_38,iVar2);
    }
    else if (iVar1 < iVar2) {
      pQVar4 = (QModelIndex *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
      local_38 = 0xffffffffffffffff;
      local_30 = 0;
      uStack_28 = 0;
      QAbstractItemModel::beginRemoveColumns(pQVar4,(int)&local_38,(int)(item->values).d.size);
    }
    lVar5 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    if (*(long **)(lVar5 + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)(lVar5 + 0x18) + 8))();
    }
    lVar5 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    *(QTreeWidgetItem **)(lVar5 + 0x18) = item;
    iVar1 = (int)(item->values).d.size;
    if (iVar2 < iVar1) {
      QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
      QAbstractItemModel::endInsertColumns();
    }
    else if (iVar1 < iVar2) {
      QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
      QAbstractItemModel::endRemoveColumns();
    }
    OVar3 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    QAbstractItemModel::headerDataChanged(OVar3,1,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidget::setHeaderItem(QTreeWidgetItem *item)
{
    Q_D(QTreeWidget);
    if (!item)
        return;
    item->view = this;

    int oldCount = columnCount();
    if (oldCount < item->columnCount())
         d->treeModel()->beginInsertColumns(QModelIndex(), oldCount, item->columnCount() - 1);
    else if (oldCount > item->columnCount())
         d->treeModel()->beginRemoveColumns(QModelIndex(), item->columnCount(), oldCount - 1);
    delete d->treeModel()->headerItem;
    d->treeModel()->headerItem = item;
    if (oldCount < item->columnCount())
        d->treeModel()->endInsertColumns();
    else if (oldCount > item->columnCount())
        d->treeModel()->endRemoveColumns();
    d->treeModel()->headerDataChanged(Qt::Horizontal, 0, oldCount);
}